

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImStb::STB_TEXTEDIT_DELETECHARS(ImGuiInputTextState *obj,int pos,int n)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ImWchar IVar3;
  undefined1 auVar4 [16];
  int iVar5;
  ImWchar *pIVar6;
  ImWchar *in_text;
  undefined1 auVar7 [16];
  
  in_text = (obj->TextW).Data + pos;
  obj->Edited = true;
  iVar5 = ImTextCountUtf8BytesFromStr(in_text,in_text + n);
  uVar1 = obj->CurLenW;
  uVar2 = obj->CurLenA;
  auVar7._4_4_ = uVar2;
  auVar7._0_4_ = uVar1;
  auVar4 = vpinsrd_avx(ZEXT416((uint)n),iVar5,1);
  auVar7._8_8_ = 0;
  auVar4 = vpsubd_avx(auVar7,auVar4);
  obj->CurLenW = (int)auVar4._0_8_;
  obj->CurLenA = (int)((ulong)auVar4._0_8_ >> 0x20);
  pIVar6 = (obj->TextW).Data + (long)pos + (long)n;
  do {
    IVar3 = *pIVar6;
    if (IVar3 != 0) {
      *in_text = IVar3;
      in_text = in_text + 1;
    }
    pIVar6 = pIVar6 + 1;
  } while (IVar3 != 0);
  *in_text = 0;
  return;
}

Assistant:

static void STB_TEXTEDIT_DELETECHARS(STB_TEXTEDIT_STRING* obj, int pos, int n)
{
    ImWchar* dst = obj->TextW.Data + pos;

    // We maintain our buffer length in both UTF-8 and wchar formats
    obj->Edited = true;
    obj->CurLenA -= ImTextCountUtf8BytesFromStr(dst, dst + n);
    obj->CurLenW -= n;

    // Offset remaining text (FIXME-OPT: Use memmove)
    const ImWchar* src = obj->TextW.Data + pos + n;
    while (ImWchar c = *src++)
        *dst++ = c;
    *dst = '\0';
}